

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O1

void __thiscall duckdb::DatabaseHeader::Write(DatabaseHeader *this,WriteStream *ser)

{
  uint64_t local_20;
  
  local_20 = this->iteration;
  (**ser->_vptr_WriteStream)(ser,&local_20,8);
  local_20 = this->meta_block;
  (**ser->_vptr_WriteStream)(ser,&local_20,8);
  local_20 = this->free_list;
  (**ser->_vptr_WriteStream)(ser,&local_20,8);
  local_20 = this->block_count;
  (**ser->_vptr_WriteStream)(ser,&local_20,8);
  local_20 = this->block_alloc_size;
  (**ser->_vptr_WriteStream)(ser,&local_20,8);
  local_20 = this->vector_size;
  (**ser->_vptr_WriteStream)(ser,&local_20,8);
  local_20 = this->serialization_compatibility;
  (**ser->_vptr_WriteStream)(ser,&local_20,8);
  return;
}

Assistant:

void DatabaseHeader::Write(WriteStream &ser) {
	ser.Write<uint64_t>(iteration);
	ser.Write<idx_t>(meta_block);
	ser.Write<idx_t>(free_list);
	ser.Write<uint64_t>(block_count);
	ser.Write<idx_t>(block_alloc_size);
	ser.Write<idx_t>(vector_size);
	ser.Write<idx_t>(serialization_compatibility);
}